

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int arkLsMassSetup(ARKodeMem ark_mem,sunrealtype t,N_Vector vtemp1,N_Vector vtemp2,N_Vector vtemp3)

{
  undefined8 uVar1;
  undefined8 uVar2;
  double dVar3;
  bool bVar4;
  int iVar5;
  undefined4 uVar6;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  char *pcVar7;
  ARKodeMem in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  int retval;
  int call_lssetup;
  int call_mvsetup;
  int call_mtsetup;
  ARKLsMassMem arkls_mem;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  uint uVar8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  ARKodeMem in_stack_ffffffffffffffc8;
  int local_4;
  
  dVar3 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  pcVar7 = "arkLsMassSetup";
  local_4 = arkLs_AccessMassMem(in_stack_ffffffffffffffc8,
                                (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0
                                                ),
                                (ARKLsMassMem *)
                                CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (local_4 == 0) {
    iVar5 = SUNLinSolGetType(in_stack_ffffffffffffffc8->step_init);
    if (iVar5 == 3) {
      *(undefined4 *)&in_stack_ffffffffffffffc8->step_setdefaults = 0;
      local_4 = *(int *)&in_stack_ffffffffffffffc8->step_setdefaults;
    }
    else if (in_RDI->uround * 100.0 <= ABS(in_stack_ffffffffffffffc8->SRabstol - dVar3)) {
      bVar4 = false;
      if ((in_stack_ffffffffffffffc8->step_reset != (ARKTimestepReset)0x0) &&
         ((in_stack_ffffffffffffffc8->atolmin0 != 0 ||
          (in_stack_ffffffffffffffc8->efun == (ARKEwtFn)0x0)))) {
        bVar4 = true;
      }
      if (bVar4) {
        iVar5 = (*in_stack_ffffffffffffffc8->step_reset)
                          ((ARKodeMem)in_stack_ffffffffffffffc8->step_printmem,dVar3,
                           (N_Vector)pcVar7);
        *(int *)&in_stack_ffffffffffffffc8->step_setdefaults = iVar5;
        in_stack_ffffffffffffffc8->efun = in_stack_ffffffffffffffc8->efun + 1;
        in_stack_ffffffffffffffc8->SRabstol = dVar3;
        if (*(int *)&in_stack_ffffffffffffffc8->step_setdefaults != 0) {
          arkProcessError(in_RDI,(int)(ulong)*(uint *)&in_stack_ffffffffffffffc8->step_setdefaults,
                          0xe6a,"arkLsMassSetup",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                          ,
                          "The mass matrix x vector setup routine failed in an unrecoverable manner."
                         );
          return *(int *)&in_stack_ffffffffffffffc8->step_setdefaults;
        }
      }
      if (in_stack_ffffffffffffffc8->user_data == (void *)0x0) {
        uVar8 = (uint)(in_stack_ffffffffffffffc8->step_setuserdata != (ARKTimetepSetUserDataFn)0x0);
        bVar4 = false;
      }
      else {
        if ((in_stack_ffffffffffffffc8->atolmin0 == 0) &&
           (0 < (long)in_stack_ffffffffffffffc8->VRabstol)) {
          *(undefined4 *)&in_stack_ffffffffffffffc8->step_setdefaults = 0;
          return *(int *)&in_stack_ffffffffffffffc8->step_setdefaults;
        }
        if ((*(int *)&in_stack_ffffffffffffffc8->sunctx == 0) &&
           (iVar5 = SUNMatZero(in_stack_ffffffffffffffc8->user_data), iVar5 != 0)) {
          arkProcessError(in_RDI,-0xb,0xe8a,"arkLsMassSetup",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                          ,"A SUNMatrix routine failed in an unrecoverable manner.");
          *(undefined4 *)&in_stack_ffffffffffffffc8->step_setdefaults = 0xfffffff5;
          return *(int *)&in_stack_ffffffffffffffc8->step_setdefaults;
        }
        iVar5 = (*(code *)in_stack_ffffffffffffffc8->uround)
                          (in_XMM0_Da,in_stack_ffffffffffffffc8->user_data,
                           in_stack_ffffffffffffffc8->reltol,in_RSI,in_RDX,in_RCX);
        in_stack_ffffffffffffffc8->SRabstol = dVar3;
        if (iVar5 < 0) {
          arkProcessError(in_RDI,-9,0xe97,"arkLsMassSetup",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                          ,"The mass matrix routine failed in an unrecoverable manner.");
          *(undefined4 *)&in_stack_ffffffffffffffc8->step_setdefaults = 0xfffffff7;
          return -1;
        }
        if (0 < iVar5) {
          *(undefined4 *)&in_stack_ffffffffffffffc8->step_setdefaults = 0xfffffff6;
          return 1;
        }
        if ((*(int *)&in_stack_ffffffffffffffc8->sunctx == 0) &&
           (uVar1._0_4_ = in_stack_ffffffffffffffc8->itol,
           uVar1._4_4_ = in_stack_ffffffffffffffc8->ritol,
           iVar5 = SUNMatCopy(in_stack_ffffffffffffffc8->user_data,uVar1), iVar5 != 0)) {
          arkProcessError(in_RDI,-0xb,0xea8,"arkLsMassSetup",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                          ,"A SUNMatrix routine failed in an unrecoverable manner.");
          *(undefined4 *)&in_stack_ffffffffffffffc8->step_setdefaults = 0xfffffff5;
          return *(int *)&in_stack_ffffffffffffffc8->step_setdefaults;
        }
        if ((in_stack_ffffffffffffffc8->step_free == (ARKTimestepFree)0x0) &&
           (*(long *)(*(long *)((long)in_stack_ffffffffffffffc8->user_data + 8) + 0x38) != 0)) {
          bVar4 = true;
        }
        else {
          bVar4 = false;
        }
        uVar8 = 1;
      }
      if (bVar4) {
        iVar5 = SUNMatMatvecSetup(in_stack_ffffffffffffffc8->user_data);
        *(long *)&in_stack_ffffffffffffffc8->user_rfun =
             *(long *)&in_stack_ffffffffffffffc8->user_rfun + 1;
        if (iVar5 != 0) {
          arkProcessError(in_RDI,-0xb,0xec2,"arkLsMassSetup",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                          ,"A SUNMatrix routine failed in an unrecoverable manner.");
          *(undefined4 *)&in_stack_ffffffffffffffc8->step_setdefaults = 0xfffffff5;
          return *(int *)&in_stack_ffffffffffffffc8->step_setdefaults;
        }
      }
      if (uVar8 != 0) {
        uVar2._0_4_ = in_stack_ffffffffffffffc8->itol;
        uVar2._4_4_ = in_stack_ffffffffffffffc8->ritol;
        uVar6 = SUNLinSolSetup(in_stack_ffffffffffffffc8->step_init,uVar2);
        *(undefined4 *)&in_stack_ffffffffffffffc8->step_setdefaults = uVar6;
        in_stack_ffffffffffffffc8->VRabstol =
             (N_Vector)((long)&in_stack_ffffffffffffffc8->VRabstol->content + 1);
      }
      local_4 = *(int *)&in_stack_ffffffffffffffc8->step_setdefaults;
    }
    else {
      *(undefined4 *)&in_stack_ffffffffffffffc8->step_setdefaults = 0;
      local_4 = *(int *)&in_stack_ffffffffffffffc8->step_setdefaults;
    }
  }
  return local_4;
}

Assistant:

int arkLsMassSetup(ARKodeMem ark_mem, sunrealtype t, N_Vector vtemp1,
                   N_Vector vtemp2, N_Vector vtemp3)
{
  ARKLsMassMem arkls_mem;
  sunbooleantype call_mtsetup, call_mvsetup, call_lssetup;
  int retval;

  /* access ARKLsMassMem structure */
  retval = arkLs_AccessMassMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Immediately return when using matrix-embedded linear solver */
  if (SUNLinSolGetType(arkls_mem->LS) == SUNLINEARSOLVER_MATRIX_EMBEDDED)
  {
    arkls_mem->last_flag = ARKLS_SUCCESS;
    return (arkls_mem->last_flag);
  }

  /* if the most recent setup essentially matches the current time,
     just return with success */
  if (SUNRabs(arkls_mem->msetuptime - t) < FUZZ_FACTOR * ark_mem->uround)
  {
    arkls_mem->last_flag = ARKLS_SUCCESS;
    return (arkls_mem->last_flag);
  }

  /* Determine whether to call user-provided mtsetup routine */
  call_mtsetup = SUNFALSE;
  if ((arkls_mem->mtsetup) &&
      (arkls_mem->time_dependent || (arkls_mem->nmtsetup == 0)))
  {
    call_mtsetup = SUNTRUE;
  }

  /* call user-provided mtsetup routine if applicable */
  if (call_mtsetup)
  {
    arkls_mem->last_flag = arkls_mem->mtsetup(t, arkls_mem->mt_data);
    arkls_mem->nmtsetup++;
    arkls_mem->msetuptime = t;
    if (arkls_mem->last_flag != 0)
    {
      arkProcessError(ark_mem, arkls_mem->last_flag, __LINE__, __func__,
                      __FILE__, MSG_LS_MTSETUP_FAILED);
      return (arkls_mem->last_flag);
    }
  }

  /* Perform user-facing setup based on whether this is matrix-free */
  if (arkls_mem->M == NULL)
  {
    /*** matrix-free -- only call LS setup if preconditioner setup exists ***/
    call_lssetup = (arkls_mem->pset != NULL);
    /*** matrix-free -- dont call matvec setup ***/
    call_mvsetup = SUNFALSE;
  }
  else
  {
    /*** matrix-based ***/

    /* If mass matrix is not time dependent, and if it has been set up
       previously, then just reuse existing matrix and factorization */
    if (!arkls_mem->time_dependent && (arkls_mem->nmsetups > 0))
    {
      arkls_mem->last_flag = ARKLS_SUCCESS;
      return (arkls_mem->last_flag);
    }

    /* Clear the mass matrix if necessary (direct linear solvers) */
    if (!(arkls_mem->iterative))
    {
      retval = SUNMatZero(arkls_mem->M);
      if (retval)
      {
        arkProcessError(ark_mem, ARKLS_SUNMAT_FAIL, __LINE__, __func__,
                        __FILE__, MSG_LS_SUNMAT_FAILED);
        arkls_mem->last_flag = ARKLS_SUNMAT_FAIL;
        return (arkls_mem->last_flag);
      }
    }

    /* Call user-supplied routine to fill the mass matrix */
    retval = arkls_mem->mass(t, arkls_mem->M, arkls_mem->M_data, vtemp1, vtemp2,
                             vtemp3);
    arkls_mem->msetuptime = t;
    if (retval < 0)
    {
      arkProcessError(ark_mem, ARKLS_MASSFUNC_UNRECVR, __LINE__, __func__,
                      __FILE__, MSG_LS_MASSFUNC_FAILED);
      arkls_mem->last_flag = ARKLS_MASSFUNC_UNRECVR;
      return (-1);
    }
    if (retval > 0)
    {
      arkls_mem->last_flag = ARKLS_MASSFUNC_RECVR;
      return (1);
    }

    /* Copy M into M_lu for factorization (direct linear solvers) */
    if (!(arkls_mem->iterative))
    {
      retval = SUNMatCopy(arkls_mem->M, arkls_mem->M_lu);
      if (retval)
      {
        arkProcessError(ark_mem, ARKLS_SUNMAT_FAIL, __LINE__, __func__,
                        __FILE__, MSG_LS_SUNMAT_FAILED);
        arkls_mem->last_flag = ARKLS_SUNMAT_FAIL;
        return (arkls_mem->last_flag);
      }
    }

    /* signal call to matvec setup routine only if the user didn't provide
       mtimes and the SUNMatrix implements the matvecsetup routine */
    if ((!arkls_mem->mtimes) && (arkls_mem->M->ops->matvecsetup))
    {
      call_mvsetup = SUNTRUE;
    }
    else { call_mvsetup = SUNFALSE; }

    /* signal call to LS setup routine */
    call_lssetup = SUNTRUE;
  }

  /* Call matvec setup routine if applicable */
  if (call_mvsetup)
  {
    retval = SUNMatMatvecSetup(arkls_mem->M);
    arkls_mem->nmvsetup++;
    if (retval)
    {
      arkProcessError(ark_mem, ARKLS_SUNMAT_FAIL, __LINE__, __func__, __FILE__,
                      MSG_LS_SUNMAT_FAILED);
      arkls_mem->last_flag = ARKLS_SUNMAT_FAIL;
      return (arkls_mem->last_flag);
    }
  }

  /* Call LS setup routine if applicable, and return */
  if (call_lssetup)
  {
    arkls_mem->last_flag = SUNLinSolSetup(arkls_mem->LS, arkls_mem->M_lu);
    arkls_mem->nmsetups++;
  }

  return (arkls_mem->last_flag);
}